

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::addLearnedClause(SimpSolver *this,vec<Minisat::Lit> *cls)

{
  uint64_t *puVar1;
  Lit *pLVar2;
  int iVar3;
  bool bVar4;
  CRef CVar5;
  ulong uVar6;
  undefined8 uStack_18;
  
  uVar6 = 0;
  uStack_18 = (ulong)(uint)cls->sz;
  if (cls->sz < 1) {
    uStack_18 = uVar6;
  }
  do {
    if (uStack_18 == uVar6) {
      if ((this->super_Solver).receiveClauses == true) {
        puVar1 = &(this->super_Solver).receivedCls;
        *puVar1 = *puVar1 + 1;
        if (cls->sz == 1) {
          iVar3 = cls->data->x;
          uStack_18._0_4_ =
               CONCAT13((byte)iVar3 & 1 ^ (this->super_Solver).assigns.data[iVar3 >> 1].value,
                        (undefined3)uStack_18);
          uStack_18 = (ulong)(uint)uStack_18;
          bVar4 = lbool::operator==((lbool *)((long)&uStack_18 + 3),(lbool)0x1);
          if (bVar4) {
            (this->super_Solver).ok = false;
          }
          else {
            Solver::cancelUntil(&this->super_Solver,0,false);
            iVar3 = cls->data->x;
            uStack_18._0_3_ =
                 CONCAT12((byte)iVar3 & 1 ^ (this->super_Solver).assigns.data[iVar3 >> 1].value,
                          (undefined2)uStack_18);
            bVar4 = lbool::operator==((lbool *)((long)&uStack_18 + 2),(lbool)0x2);
            if (bVar4) {
              Solver::uncheckedEnqueue(&this->super_Solver,(Lit)cls->data->x,0,0xffffffff);
            }
          }
        }
        else {
          CVar5 = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                            (&(this->super_Solver).ca,cls,true);
          uStack_18._4_4_ = CVar5;
          vec<unsigned_int>::push
                    (&(this->super_Solver).learnts_local,(uint *)((long)&uStack_18 + 4));
          Solver::attachClause(&this->super_Solver,uStack_18._4_4_);
          Solver::claBumpActivity
                    (&this->super_Solver,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     uStack_18._4_4_));
        }
      }
      return;
    }
    pLVar2 = cls->data + uVar6;
    uVar6 = uVar6 + 1;
  } while ((this->eliminated).data[pLVar2->x >> 1] == '\0');
  return;
}

Assistant:

void SimpSolver::addLearnedClause(const vec<Lit> &cls)
{
    /* do not receive clauses that contain eliminated variables */
    for (int i = 0; i < cls.size(); ++i)
        if (isEliminated(var(cls[i]))) return;
    Solver::addLearnedClause(cls);
}